

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duseltronik.hpp
# Opt level: O0

bool tao::pegtl::internal::
     duseltronik<ovf::detail::parse::v2::check_value_bin_4,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)0,ovf::detail::parse::v2::ovf_segment_data_action,tao::pegtl::normal,(tao::pegtl::internal::dusel_mode)2>
     ::
     match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,ovf_file *st,ovf_segment *st_1,float **st_2)

{
  bool bVar1;
  iterator *begin;
  undefined1 local_58 [8];
  marker<tao::pegtl::internal::iterator,_(tao::pegtl::rewind_mode)1> m;
  float **st_local_2;
  ovf_segment *st_local_1;
  ovf_file *st_local;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_local;
  
  m.m_input = (iterator *)st_2;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::mark<(tao::pegtl::rewind_mode)1>
            ((marker<tao::pegtl::internal::iterator,_(tao::pegtl::rewind_mode)1> *)local_58,in);
  normal<ovf::detail::parse::v2::check_value_bin_4>::
  start<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&>
            (in,st,st_1,(float **)m.m_input);
  bVar1 = duseltronik<ovf::detail::parse::v2::check_value_bin_4,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)0,ovf::detail::parse::v2::ovf_segment_data_action,tao::pegtl::normal,(tao::pegtl::internal::dusel_mode)0>
          ::
          match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&,0>
                    (in,st,st_1,(float **)m.m_input);
  if (bVar1) {
    begin = marker<tao::pegtl::internal::iterator,_(tao::pegtl::rewind_mode)1>::iterator
                      ((marker<tao::pegtl::internal::iterator,_(tao::pegtl::rewind_mode)1> *)
                       local_58);
    normal<ovf::detail::parse::v2::check_value_bin_4>::
    apply<ovf::detail::parse::v2::ovf_segment_data_action,_tao::pegtl::internal::iterator,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ovf_file_&,_const_ovf_segment_&,_float_*&>
              (begin,in,st,st_1,(float **)m.m_input);
    normal<ovf::detail::parse::v2::check_value_bin_4>::
    success<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&>
              (in,st,st_1,(float **)m.m_input);
    in_local._7_1_ =
         marker<tao::pegtl::internal::iterator,_(tao::pegtl::rewind_mode)1>::operator()
                   ((marker<tao::pegtl::internal::iterator,_(tao::pegtl::rewind_mode)1> *)local_58,
                    true);
  }
  else {
    normal<ovf::detail::parse::v2::check_value_bin_4>::
    failure<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&>
              (in,st,st_1,(float **)m.m_input);
    in_local._7_1_ = false;
  }
  marker<tao::pegtl::internal::iterator,_(tao::pegtl::rewind_mode)1>::~marker
            ((marker<tao::pegtl::internal::iterator,_(tao::pegtl::rewind_mode)1> *)local_58);
  return in_local._7_1_;
}

Assistant:

static bool match( Input& in, States&&... st )
            {
               auto m = in.template mark< rewind_mode::required >();

               Control< Rule >::start( static_cast< const Input& >( in ), st... );

               if( duseltronik< Rule, A, rewind_mode::active, Action, Control, dusel_mode::nothing >::match( in, st... ) ) {
                  Control< Rule >::template apply< Action >( m.iterator(), static_cast< const Input& >( in ), st... );
                  Control< Rule >::success( static_cast< const Input& >( in ), st... );
                  return m( true );
               }
               Control< Rule >::failure( static_cast< const Input& >( in ), st... );
               return false;
            }